

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::length2(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *__return_storage_ptr__,
         SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this)

{
  long lVar1;
  cpp_dec_float<200U,_int,_void> *pcVar2;
  cpp_dec_float<200U,_int,_void> *pcVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  long lVar6;
  byte bVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_a8;
  
  bVar7 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&__return_storage_ptr__->m_backend,0,(type *)0x0);
  if (this->setupStatus == true) {
    if (0 < (this->super_IdxSet).num) {
      lVar6 = 0;
      do {
        pcVar3 = &(this->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(this->super_IdxSet).idx[lVar6]].
                  m_backend;
        local_a8.fpclass = cpp_dec_float_finite;
        local_a8.prec_elem = 0x1c;
        local_a8.data._M_elems[0] = 0;
        local_a8.data._M_elems[1] = 0;
        local_a8.data._M_elems[2] = 0;
        local_a8.data._M_elems[3] = 0;
        local_a8.data._M_elems[4] = 0;
        local_a8.data._M_elems[5] = 0;
        local_a8.data._M_elems[6] = 0;
        local_a8.data._M_elems[7] = 0;
        local_a8.data._M_elems[8] = 0;
        local_a8.data._M_elems[9] = 0;
        local_a8.data._M_elems[10] = 0;
        local_a8.data._M_elems[0xb] = 0;
        local_a8.data._M_elems[0xc] = 0;
        local_a8.data._M_elems[0xd] = 0;
        local_a8.data._M_elems[0xe] = 0;
        local_a8.data._M_elems[0xf] = 0;
        local_a8.data._M_elems[0x10] = 0;
        local_a8.data._M_elems[0x11] = 0;
        local_a8.data._M_elems[0x12] = 0;
        local_a8.data._M_elems[0x13] = 0;
        local_a8.data._M_elems[0x14] = 0;
        local_a8.data._M_elems[0x15] = 0;
        local_a8.data._M_elems[0x16] = 0;
        local_a8.data._M_elems[0x17] = 0;
        local_a8.data._M_elems[0x18] = 0;
        local_a8.data._M_elems[0x19] = 0;
        local_a8.data._M_elems._104_5_ = 0;
        local_a8.data._M_elems[0x1b]._1_3_ = 0;
        local_a8.exp = 0;
        local_a8.neg = false;
        if (&local_a8 != pcVar3) {
          pcVar2 = pcVar3;
          pcVar4 = &local_a8;
          for (lVar1 = 0x1c; lVar1 != 0; lVar1 = lVar1 + -1) {
            *(uint *)pcVar4 = (pcVar2->data)._M_elems[0];
            pcVar2 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar2 + (ulong)bVar7 * -8 + 4);
            pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + ((ulong)bVar7 * -2 + 1) * 4);
          }
          local_a8.exp = pcVar3->exp;
          local_a8.neg = pcVar3->neg;
          local_a8.fpclass = pcVar3->fpclass;
          local_a8.prec_elem = pcVar3->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_a8,pcVar3);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&__return_storage_ptr__->m_backend,&local_a8);
        lVar6 = lVar6 + 1;
      } while (lVar6 < (this->super_IdxSet).num);
    }
  }
  else {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator*((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_a8,
                &this->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&this->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    pcVar3 = &local_a8;
    pnVar5 = __return_storage_ptr__;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar5->m_backend).data._M_elems[0] = *(uint *)pcVar3;
      pcVar3 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar3 + ((ulong)bVar7 * -2 + 1) * 4);
      pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    (__return_storage_ptr__->m_backend).exp = local_a8.exp;
    (__return_storage_ptr__->m_backend).neg = local_a8.neg;
    (__return_storage_ptr__->m_backend).fpclass = local_a8.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = local_a8.prec_elem;
  }
  return __return_storage_ptr__;
}

Assistant:

R length2() const
   {
      R x = 0;

      if(isSetup())
      {
         for(int i = 0; i < num; ++i)
            x += VectorBase<R>::val[idx[i]] * VectorBase<R>::val[idx[i]];
      }
      else
         x = VectorBase<R>::length2();

      return x;
   }